

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O2

void cf2_freeT1SeacComponent(PS_Decoder *decoder,CF2_Buffer buf)

{
  FT_Incremental_InterfaceRec *pFVar1;
  undefined1 local_18 [8];
  FT_Data data;
  
  local_18 = (undefined1  [8])buf->start;
  data.pointer._0_4_ = *(int *)&buf->end - SUB84(local_18,0);
  pFVar1 = ((decoder->builder).face)->internal->incremental_interface;
  if (pFVar1 != (FT_Incremental_InterfaceRec *)0x0) {
    (*pFVar1->funcs->free_glyph_data)(pFVar1->object,(FT_Data *)local_18);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_freeT1SeacComponent( PS_Decoder*  decoder,
                           CF2_Buffer   buf )
  {
    T1_Face  face;
    FT_Data  data;


    FT_ASSERT( decoder );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    face = (T1_Face)decoder->builder.face;

    data.pointer = buf->start;
    data.length  = (FT_Int)( buf->end - buf->start );

    if ( face->root.internal->incremental_interface )
      face->root.internal->incremental_interface->funcs->free_glyph_data(
        face->root.internal->incremental_interface->object,
        &data );
#endif /* FT_CONFIG_OPTION_INCREMENTAL */
  }